

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  LogMessage *other;
  ParseContext ctx;
  ZeroCopyCodedInputStream zcis;
  LogFinisher local_e1;
  EpsCopyInputStream local_e0;
  int local_88;
  undefined4 local_84;
  DescriptorPool *local_80;
  MessageFactory *pMStack_78;
  ZeroCopyInputStream local_70;
  CodedInputStream *local_68;
  LogMessage local_60;
  
  local_70._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_0020be00;
  local_88 = input->recursion_budget_;
  local_e0.aliasing_ = (uintptr_t)input->aliasing_enabled_;
  local_e0.buffer_[8] = '\0';
  local_e0.buffer_[9] = '\0';
  local_e0.buffer_[10] = '\0';
  local_e0.buffer_[0xb] = '\0';
  local_e0.buffer_[0xc] = '\0';
  local_e0.buffer_[0xd] = '\0';
  local_e0.buffer_[0xe] = '\0';
  local_e0.buffer_[0xf] = '\0';
  local_e0.buffer_[0x10] = '\0';
  local_e0.buffer_[0x11] = '\0';
  local_e0.buffer_[0x12] = '\0';
  local_e0.buffer_[0x13] = '\0';
  local_e0.buffer_[0x14] = '\0';
  local_e0.buffer_[0x15] = '\0';
  local_e0.buffer_[0x16] = '\0';
  local_e0.buffer_[0x17] = '\0';
  local_e0.zcis_ = (ZeroCopyInputStream *)0x0;
  local_e0.buffer_[0] = '\0';
  local_e0.buffer_[1] = '\0';
  local_e0.buffer_[2] = '\0';
  local_e0.buffer_[3] = '\0';
  local_e0.buffer_[4] = '\0';
  local_e0.buffer_[5] = '\0';
  local_e0.buffer_[6] = '\0';
  local_e0.buffer_[7] = '\0';
  local_e0.buffer_[0x18] = '\0';
  local_e0.buffer_[0x19] = '\0';
  local_e0.buffer_[0x1a] = '\0';
  local_e0.buffer_[0x1b] = '\0';
  local_e0.buffer_[0x1c] = '\0';
  local_e0.buffer_[0x1d] = '\0';
  local_e0.buffer_[0x1e] = '\0';
  local_e0.buffer_[0x1f] = '\0';
  local_e0.last_tag_minus_1_ = 0;
  local_e0.overall_limit_ = 0x7fffffff;
  local_84 = 0x80000000;
  local_80 = (DescriptorPool *)0x0;
  pMStack_78 = (MessageFactory *)0x0;
  local_68 = input;
  pcVar2 = internal::EpsCopyInputStream::InitFrom(&local_e0,&local_70);
  local_84 = 0;
  local_80 = input->extension_pool_;
  pMStack_78 = input->extension_factory_;
  iVar1 = (*this->_vptr_MessageLite[0xb])(this,pcVar2,&local_e0);
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  if (pcVar2 != (char *)0x0) {
    internal::EpsCopyInputStream::BackUp(&local_e0,pcVar2);
    if (local_e0.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if (local_e0.last_tag_minus_1_ == 0) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,"third_party/protobuf-lite/message_lite.cc",0xf0);
        other = internal::LogMessage::operator<<(&local_60,"CHECK failed: ctx.LastTag() != 1: ");
        internal::LogFinisher::operator=(&local_e1,other);
        internal::LogMessage::~LogMessage(&local_60);
      }
      if (local_e0.limit_end_ < pcVar2) {
        if (local_e0.next_chunk_ == (char *)0x0) {
          return false;
        }
        if ((long)local_e0.limit_ < (long)pcVar2 - (long)local_e0.buffer_end_) {
          return false;
        }
      }
      input->last_tag_ = local_e0.last_tag_minus_1_ + 1;
    }
    if ((parse_flags & kMergePartial) != kMerge) {
      return true;
    }
    iVar1 = (*this->_vptr_MessageLite[6])(this);
    if ((char)iVar1 != '\0') {
      return true;
    }
    LogInitializationErrorMessage(this);
  }
  return false;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}